

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  N_Vector unaff_retaddr;
  int i;
  SplittingStepCoefficients coefficients;
  ARKodeMem in_stack_00000018;
  int retval;
  ARKodeSplittingStepMem step_mem;
  ARKodeSplittingStepMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar2;
  ARKodeMem in_stack_ffffffffffffffc8;
  long *plVar3;
  int local_4;
  
  local_4 = splittingStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    *in_RDX = 0;
    *in_RSI = 0;
    plVar3 = plRam0000000000000008;
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 0x248));
    local_4 = splittingStep_SequentialMethod
                        (in_stack_00000018,(ARKodeSplittingStepMem)coefficients,i,unaff_retaddr);
    if (local_4 == 0) {
      if ((*(double *)*plVar3 != 1.0) || (NAN(*(double *)*plVar3))) {
        N_VScale(*(undefined8 *)*plVar3,*(undefined8 *)(in_RDI + 0x248),
                 *(undefined8 *)(in_RDI + 0x248));
      }
      for (iVar2 = 1; iVar2 < (int)plVar3[2]; iVar2 = iVar2 + 1) {
        N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 0x268))
        ;
        iVar1 = splittingStep_SequentialMethod
                          (in_stack_00000018,(ARKodeSplittingStepMem)coefficients,i,unaff_retaddr);
        if (iVar1 != 0) {
          return iVar1;
        }
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(*plVar3 + (long)iVar2 * 8),
                     *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x268),
                     *(undefined8 *)(in_RDI + 0x248));
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int splittingStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  *nflagPtr = ARK_SUCCESS; /* No algebraic solver */
  *dsmPtr   = ZERO;        /* No error estimate */

  SplittingStepCoefficients coefficients = step_mem->coefficients;

  SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = 0");

  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  retval = splittingStep_SequentialMethod(ark_mem, step_mem, 0, ark_mem->ycur);
  SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->ycur,
                      "y_seq(:) =");
  if (retval != ARK_SUCCESS)
  {
    SUNLogInfo(ARK_LOGGER, "end-sequential-method",
               "status = failed sequential method, retval = %i", retval);
    return retval;
  }

  if (coefficients->alpha[0] != ONE)
  {
    N_VScale(coefficients->alpha[0], ark_mem->ycur, ark_mem->ycur);
  }
  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");

  for (int i = 1; i < coefficients->sequential_methods; i++)
  {
    SUNLogInfo(ARK_LOGGER, "begin-sequential-method", "sequential method = %i",
               i);

    N_VScale(ONE, ark_mem->yn, ark_mem->tempv1);
    retval = splittingStep_SequentialMethod(ark_mem, step_mem, i,
                                            ark_mem->tempv1);
    SUNLogExtraDebugVec(ARK_LOGGER, "sequential state", ark_mem->tempv1,
                        "y_seq(:) =");
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-sequential-method",
                 "status = failed sequential method, retval = %i", retval);
      return retval;
    }
    N_VLinearSum(ONE, ark_mem->ycur, coefficients->alpha[i], ark_mem->tempv1,
                 ark_mem->ycur);

    SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");
    SUNLogInfo(ARK_LOGGER, "end-sequential-method", "status = success");
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "current state", ark_mem->ycur, "y_cur(:) =");

  return ARK_SUCCESS;
}